

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int udp_ep_get_locaddr(void *arg,void *v,size_t *szp,nni_opt_type t)

{
  int iVar1;
  undefined1 local_a8 [8];
  nng_sockaddr sa;
  
  if (*arg == (nni_plat_udp *)0x0) {
    memcpy(local_a8,(void *)((long)arg + 0x858),0x88);
  }
  else {
    nni_plat_udp_sockname(*arg,(nni_sockaddr *)local_a8);
  }
  iVar1 = nni_copyout_sockaddr((nng_sockaddr *)local_a8,v,szp,t);
  return iVar1;
}

Assistant:

static int
udp_ep_get_locaddr(void *arg, void *v, size_t *szp, nni_opt_type t)
{
	udp_ep      *ep = arg;
	int          rv;
	nng_sockaddr sa;

	if (ep->udp != NULL) {
		(void) nni_udp_sockname(ep->udp, &sa);
	} else {
		sa = ep->self_sa;
	}

	rv = nni_copyout_sockaddr(&sa, v, szp, t);
	return (rv);
}